

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

void cvRestore(CVodeMem cv_mem,sunrealtype saved_t)

{
  long lVar1;
  long lVar2;
  
  cv_mem->cv_tn = saved_t;
  for (lVar2 = 1; lVar1 = (long)cv_mem->cv_q, lVar2 <= lVar1; lVar2 = lVar2 + 1) {
    for (; lVar2 <= lVar1; lVar1 = lVar1 + -1) {
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,cv_mem->cv_zn[lVar1 + -1],
                   cv_mem->cv_zn[lVar1],cv_mem->cv_zn[lVar1 + -1]);
    }
  }
  return;
}

Assistant:

void cvRestore(CVodeMem cv_mem, sunrealtype saved_t)
{
  int j, k;

  cv_mem->cv_tn = saved_t;
  for (k = 1; k <= cv_mem->cv_q; k++)
  {
    for (j = cv_mem->cv_q; j >= k; j--)
    {
      N_VLinearSum(ONE, cv_mem->cv_zn[j - 1], -ONE, cv_mem->cv_zn[j],
                   cv_mem->cv_zn[j - 1]);
    }
  }
}